

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree.hpp
# Opt level: O2

NodeIterator __thiscall
Indexing::RetrievalAlgorithms::
UnificationWithAbstraction<Kernel::AbstractingUnifier,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>
::_selectPotentiallyUnifiableChildren<Inferences::ALASCA::FourierMotzkinConf::Rhs>
          (UnificationWithAbstraction<Kernel::AbstractingUnifier,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>
           *this,IntermediateNode *n,AbstractingUnifier *unif,uint normInternalBank)

{
  anon_class_24_2_fa5da250_for__func f;
  Recycled<Lib::Stack<unsigned_int>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> *a;
  CatIterator<Lib::IterTraits<Lib::FilteredIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1781:65),_unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Indexing_SubstitutionTree_hpp:1539:33),_Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node_**>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Indexing_SubstitutionTree_hpp:1540:33),_false>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node_**>_>_>
  *i;
  Top TVar1;
  Option<Lib::Recycled<Lib::Stack<unsigned_int>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>_> syms
  ;
  VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node_**>
  local_250;
  VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node_**>
  local_248;
  VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node_**>
  local_240;
  IntermediateNode *local_238;
  undefined8 uStack_230;
  char local_228;
  undefined7 uStack_227;
  undefined1 local_220 [24];
  undefined1 local_208 [8];
  IntermediateNode *local_200;
  RawWithDefaultImpls<Kernel::VarNumber,_Kernel::SymbolId> RStack_1f8;
  undefined4 uStack_1ec;
  Recycled<Lib::Stack<unsigned_int>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> RStack_1e8;
  unsigned_long local_1d8;
  unsigned_long uStack_1d0;
  unsigned_long local_1c8;
  char local_1c0;
  Value local_1b8;
  IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1781:65),_unsigned_int>_>
  local_1b0;
  IterTraits<Lib::FilteredIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1781:65),_unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Indexing_SubstitutionTree_hpp:1539:33),_Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node_**>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Indexing_SubstitutionTree_hpp:1540:33),_false>_>
  local_188;
  IterTraits<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1781:65),_unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Indexing_SubstitutionTree_hpp:1539:33),_Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node_**>_>
  local_130;
  CatIterator<Lib::IterTraits<Lib::FilteredIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1781:65),_unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Indexing_SubstitutionTree_hpp:1539:33),_Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node_**>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Indexing_SubstitutionTree_hpp:1540:33),_false>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node_**>_>_>
  local_f0;
  CatIterator<Lib::IterTraits<Lib::FilteredIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1781:65),_unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Indexing_SubstitutionTree_hpp:1539:33),_Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node_**>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Indexing_SubstitutionTree_hpp:1540:33),_false>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node_**>_>_>
  local_88;
  
  if ((unif->_uwa)._mode == OFF) {
    __selectPotentiallyUnifiableChildren<Inferences::ALASCA::FourierMotzkinConf::Rhs>
              ((RetrievalAlgorithms *)this,n,
               (RobSubstitution *)
               (unif->_subs)._self._M_t.
               super___uniq_ptr_impl<Kernel::RobSubstitution,_std::default_delete<Kernel::RobSubstitution>_>
               ._M_t.
               super__Tuple_impl<0UL,_Kernel::RobSubstitution_*,_std::default_delete<Kernel::RobSubstitution>_>
               .super__Head_base<0UL,_Kernel::RobSubstitution_*,_false>,normInternalBank);
  }
  else {
    TVar1 = Kernel::RobSubstitution::getSpecialVarTop
                      ((RobSubstitution *)
                       (unif->_subs)._self._M_t.
                       super___uniq_ptr_impl<Kernel::RobSubstitution,_std::default_delete<Kernel::RobSubstitution>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Kernel::RobSubstitution_*,_std::default_delete<Kernel::RobSubstitution>_>
                       .super__Head_base<0UL,_Kernel::RobSubstitution_*,_false>,n->childVar,
                       normInternalBank);
    if (((undefined1  [12])TVar1._inner._inner & (undefined1  [12])0x1) == (undefined1  [12])0x0) {
      (*(n->super_Node)._vptr_Node[8])(this,n);
    }
    else {
      Kernel::AbstractingUnifier::unifiableSymbols
                ((Option<Lib::Recycled<Lib::Stack<unsigned_int>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>_>
                  *)local_220,unif,TVar1._inner._inner._content);
      if (local_220[0] == true) {
        Lib::
        arrayIter<Lib::Recycled<Lib::Stack<unsigned_int>,Lib::DefaultReset,Lib::DefaultKeepRecycled>>
                  (&local_1b0,(Lib *)(local_220 + 8),a);
        f._17_7_ = uStack_227;
        f.top._inner._inner._content[7] = TVar1._inner._inner._content[7];
        f.top._inner._inner._0_8_ = TVar1._inner._inner._0_8_;
        f.n = n;
        local_238 = n;
        uStack_230 = TVar1._inner._inner._0_8_;
        local_228 = TVar1._inner._inner._content[7];
        Lib::
        IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,Lib::arrayIter<Lib::Recycled<Lib::Stack<unsigned_int>,Lib::DefaultReset,Lib::DefaultKeepRecycled>,unsigned_long>(Lib::Recycled<Lib::Stack<unsigned_int>,Lib::DefaultReset,Lib::DefaultKeepRecycled>&&,unsigned_long)::{lambda(auto:1)#1},unsigned_int>>
        ::
        map<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier,Indexing::RetrievalAlgorithms::VarBanksN<0u>>::_selectPotentiallyUnifiableChildren<Inferences::ALASCA::FourierMotzkinConf::Rhs>(Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::IntermediateNode*,Kernel::AbstractingUnifier&,unsigned_int)::_lambda(auto:1)_1_>
                  (&local_130,&local_1b0,f);
        Lib::
        IterTraits<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,Lib::arrayIter<Lib::Recycled<Lib::Stack<unsigned_int>,Lib::DefaultReset,Lib::DefaultKeepRecycled>,unsigned_long>(Lib::Recycled<Lib::Stack<unsigned_int>,Lib::DefaultReset,Lib::DefaultKeepRecycled>&&,unsigned_long)::{lambda(auto:1)#1},unsigned_int>,Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier,Indexing::RetrievalAlgorithms::VarBanksN<0u>>::_selectPotentiallyUnifiableChildren<Inferences::ALASCA::FourierMotzkinConf::Rhs>(Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::IntermediateNode*,Kernel::AbstractingUnifier&,unsigned_int)::{lambda(auto:1)#1},Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node**>>
        ::
        filter<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier,Indexing::RetrievalAlgorithms::VarBanksN<0u>>::_selectPotentiallyUnifiableChildren<Inferences::ALASCA::FourierMotzkinConf::Rhs>(Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::IntermediateNode*,Kernel::AbstractingUnifier&,unsigned_int)::_lambda(auto:1)_2_>
                  (local_208,&local_130);
        (*(n->super_Node)._vptr_Node[9])(&local_250,n);
        local_188._iter._inn._inner._func.a._self._M_t.
        super___uniq_ptr_impl<Lib::Stack<unsigned_int>,_std::default_delete<Lib::Stack<unsigned_int>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_Lib::Stack<unsigned_int>_*,_std::default_delete<Lib::Stack<unsigned_int>_>_>
        .super__Head_base<0UL,_Lib::Stack<unsigned_int>_*,_false>._M_head_impl =
             RStack_1e8._self._M_t.
             super___uniq_ptr_impl<Lib::Stack<unsigned_int>,_std::default_delete<Lib::Stack<unsigned_int>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_Lib::Stack<unsigned_int>_*,_std::default_delete<Lib::Stack<unsigned_int>_>_>
             .super__Head_base<0UL,_Lib::Stack<unsigned_int>_*,_false>._M_head_impl;
        RStack_1e8._self._M_t.
        super___uniq_ptr_impl<Lib::Stack<unsigned_int>,_std::default_delete<Lib::Stack<unsigned_int>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_Lib::Stack<unsigned_int>_*,_std::default_delete<Lib::Stack<unsigned_int>_>_>
        .super__Head_base<0UL,_Lib::Stack<unsigned_int>_*,_false>._M_head_impl =
             (__uniq_ptr_data<Lib::Stack<unsigned_int>,_std::default_delete<Lib::Stack<unsigned_int>_>,_true,_true>
              )(__uniq_ptr_impl<Lib::Stack<unsigned_int>,_std::default_delete<Lib::Stack<unsigned_int>_>_>
                )0x0;
        local_188._iter._inn._func.n = local_200;
        local_188._iter._inn._func.top._inner._inner._0_1_ = RStack_1f8._0_1_;
        local_188._iter._inn._func.top._inner._inner._content[0] = RStack_1f8._content[0];
        local_188._iter._inn._func.top._inner._inner._content[1] = RStack_1f8._content[1];
        local_188._iter._inn._func.top._inner._inner._content[2] = RStack_1f8._content[2];
        local_188._iter._inn._func.top._inner._inner._content[3] = RStack_1f8._content[3];
        local_188._iter._inn._func.top._inner._inner._content[4] = RStack_1f8._content[4];
        local_188._iter._inn._func.top._inner._inner._content[5] = RStack_1f8._content[5];
        local_188._iter._inn._func.top._inner._inner._content[6] = RStack_1f8._content[6];
        local_188._iter._inn._func.top._inner._inner._content[7] = RStack_1f8._content[7];
        local_188._iter._inn._func.top._inner._inner._9_3_ = RStack_1f8._9_3_;
        local_188._iter._inn._func._20_4_ = uStack_1ec;
        local_188._iter._inn._inner._inner._next = local_1d8;
        local_188._iter._inn._inner._inner._from = uStack_1d0;
        local_188._iter._inn._inner._inner._to = local_1c8;
        local_188._iter._next.
        super_OptionBase<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node_**>
        ._isSome = (bool)local_1c0;
        if (local_1c0 == '\x01') {
          local_188._iter._next.
          super_OptionBase<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node_**>
          ._elem._elem = local_1b8;
        }
        local_248._core = local_250._core;
        if (local_250._core !=
            (IteratorCore<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node_**>
             *)0x0) {
          (local_250._core)->_refCnt = (local_250._core)->_refCnt + 1;
        }
        Lib::
        concatIters<Lib::VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node**>>
                  ((Lib *)&local_240,&local_248);
        Lib::
        CatIterator<Lib::IterTraits<Lib::FilteredIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1781:65),_unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Indexing/SubstitutionTree.hpp:1539:33),_Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node_**>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Indexing/SubstitutionTree.hpp:1540:33),_false>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node_**>_>_>
        ::CatIterator(&local_88,&local_188,
                      (IterTraits<Lib::VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node_**>_>
                       *)&local_240);
        Lib::
        iterTraits<Lib::CatIterator<Lib::IterTraits<Lib::FilteredIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,Lib::arrayIter<Lib::Recycled<Lib::Stack<unsigned_int>,Lib::DefaultReset,Lib::DefaultKeepRecycled>,unsigned_long>(Lib::Recycled<Lib::Stack<unsigned_int>,Lib::DefaultReset,Lib::DefaultKeepRecycled>&&,unsigned_long)::_lambda(auto:1)_1_,unsigned_int>,Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier,Indexing::RetrievalAlgorithms::VarBanksN<0u>>::_selectPotentiallyUnifiableChildren<Inferences::ALASCA::FourierMotzkinConf::Rhs>(Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::IntermediateNode*,Kernel::AbstractingUnifier&,unsigned_int)::_lambda(auto:1)_1_,Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node**>,Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier,Indexing::RetrievalAlgorithms::VarBanksN<0u>>::_selectPotentiallyUnifiableChildren<Inferences::ALASCA::FourierMotzkinConf::Rhs>(Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::IntermediateNode*,Kernel::AbstractingUnifier&,unsigned_int)::_lambda(auto:1)_2_,false>>,Lib::IterTraits<Lib::VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node**>>>>
                  ((IterTraits<Lib::CatIterator<Lib::IterTraits<Lib::FilteredIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1781:65),_unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Indexing_SubstitutionTree_hpp:1539:33),_Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node_**>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Indexing_SubstitutionTree_hpp:1540:33),_false>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node_**>_>_>_>
                    *)&local_f0,(Lib *)&local_88,i);
        Lib::
        CatIterator<Lib::IterTraits<Lib::FilteredIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1781:65),_unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Indexing/SubstitutionTree.hpp:1539:33),_Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node_**>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Indexing/SubstitutionTree.hpp:1540:33),_false>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node_**>_>_>
        ::~CatIterator(&local_88);
        Lib::
        VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node_**>
        ::~VirtualIterator(&local_240);
        Lib::
        VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node_**>
        ::~VirtualIterator(&local_248);
        Lib::Recycled<Lib::Stack<unsigned_int>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
        ~Recycled((Recycled<Lib::Stack<unsigned_int>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> *
                  )&local_188._iter._inn._inner);
        Lib::
        pvi<Lib::IterTraits<Lib::CatIterator<Lib::IterTraits<Lib::FilteredIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,Lib::arrayIter<Lib::Recycled<Lib::Stack<unsigned_int>,Lib::DefaultReset,Lib::DefaultKeepRecycled>,unsigned_long>(Lib::Recycled<Lib::Stack<unsigned_int>,Lib::DefaultReset,Lib::DefaultKeepRecycled>&&,unsigned_long)::_lambda(auto:1)_1_,unsigned_int>,Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier,Indexing::RetrievalAlgorithms::VarBanksN<0u>>::_selectPotentiallyUnifiableChildren<Inferences::ALASCA::FourierMotzkinConf::Rhs>(Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::IntermediateNode*,Kernel::AbstractingUnifier&,unsigned_int)::_lambda(auto:1)_1_,Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node**>,Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier,Indexing::RetrievalAlgorithms::VarBanksN<0u>>::_selectPotentiallyUnifiableChildren<Inferences::ALASCA::FourierMotzkinConf::Rhs>(Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::IntermediateNode*,Kernel::AbstractingUnifier&,unsigned_int)::_lambda(auto:1)_2_,false>>,Lib::IterTraits<Lib::VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node**>>>>>
                  ((Lib *)this,
                   (IterTraits<Lib::CatIterator<Lib::IterTraits<Lib::FilteredIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1781:65),_unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Indexing_SubstitutionTree_hpp:1539:33),_Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node_**>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Indexing_SubstitutionTree_hpp:1540:33),_false>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node_**>_>_>_>
                    *)&local_f0);
        Lib::
        CatIterator<Lib::IterTraits<Lib::FilteredIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1781:65),_unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Indexing/SubstitutionTree.hpp:1539:33),_Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node_**>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Indexing/SubstitutionTree.hpp:1540:33),_false>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node_**>_>_>
        ::~CatIterator(&local_f0);
        Lib::
        VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node_**>
        ::~VirtualIterator(&local_250);
        Lib::Recycled<Lib::Stack<unsigned_int>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
        ~Recycled(&RStack_1e8);
        Lib::Recycled<Lib::Stack<unsigned_int>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
        ~Recycled((Recycled<Lib::Stack<unsigned_int>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> *
                  )&local_130._iter._inner);
        Lib::Recycled<Lib::Stack<unsigned_int>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
        ~Recycled((Recycled<Lib::Stack<unsigned_int>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> *
                  )&local_1b0);
      }
      else {
        (*(n->super_Node)._vptr_Node[8])(this,n);
      }
      Lib::
      OptionBase<Lib::Recycled<Lib::Stack<unsigned_int>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>_>
      ::~OptionBase((OptionBase<Lib::Recycled<Lib::Stack<unsigned_int>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>_>
                     *)local_220);
    }
  }
  return (NodeIterator)
         (IteratorCore<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node_**>
          *)this;
}

Assistant:

static typename SubstitutionTree<LD>::NodeIterator _selectPotentiallyUnifiableChildren(typename SubstitutionTree<LD>::IntermediateNode* n, AbstractingUnifier& unif, unsigned normInternalBank)
        {
          if (unif.usesUwa()) {
            unsigned specVar = n->childVar;
            auto top = unif.subs().getSpecialVarTop(specVar, normInternalBank);

            if(top.var()) {
              return n->allChildren();
            } else {
              auto syms = unif.unifiableSymbols(*top.functor());
              if (syms) {
                return pvi(concatIters(
                      arrayIter(std::move(*syms))
                        .map   ([=](auto f) { return n->childByTop(top, /* canCreate */ false); })
                        .filter([ ](auto n) { return n != nullptr; }),
                      n->variableChildren()
                      ));
              } else {
                return n->allChildren();
              }
            }
          } else {
            return __selectPotentiallyUnifiableChildren<LD>(n, unif.subs(), normInternalBank);
          }
        }